

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

Wlc_Ntk_t * Wla_ManCreateAbs(Wla_Man_t *pWla)

{
  int iVar1;
  Vec_Int_t *vBlacks;
  Vec_Int_t *pVVar2;
  int *__dest;
  Wlc_Ntk_t *pWVar3;
  Vec_Int_t **extraout_RDX;
  Vec_Int_t **extraout_RDX_00;
  Vec_Int_t **pvFlops;
  size_t __size;
  
  if (pWla->vBlacks == (Vec_Int_t *)0x0) {
    vBlacks = Wlc_NtkGetBlacks(pWla->p,pWla->pPars);
    pWla->vBlacks = vBlacks;
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    iVar1 = vBlacks->nSize;
    pVVar2->nSize = iVar1;
    pVVar2->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __size = 0;
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar1 << 2;
      __dest = (int *)malloc(__size);
    }
    pVVar2->pArray = __dest;
    memcpy(__dest,vBlacks->pArray,__size);
    pWla->vSignals = pVVar2;
    pvFlops = extraout_RDX_00;
  }
  else {
    Wlc_NtkUpdateBlacks(pWla->p,pWla->pPars,&pWla->vBlacks,pWla->vUnmark,pWla->vSignals);
    vBlacks = pWla->vBlacks;
    pvFlops = extraout_RDX;
  }
  pWVar3 = Wlc_NtkAbs2(pWla->p,vBlacks,pvFlops);
  return pWVar3;
}

Assistant:

Wlc_Ntk_t * Wla_ManCreateAbs( Wla_Man_t * pWla )
{
    Wlc_Ntk_t * pAbs;

    // get abstracted GIA and the set of pseudo-PIs (vBlacks)
    if ( pWla->vBlacks == NULL )
    {
        pWla->vBlacks = Wlc_NtkGetBlacks( pWla->p, pWla->pPars );
        pWla->vSignals = Vec_IntDup( pWla->vBlacks );
    }
    else
    {
        Wlc_NtkUpdateBlacks( pWla->p, pWla->pPars, &pWla->vBlacks, pWla->vUnmark, pWla->vSignals );
    }
    pAbs = Wlc_NtkAbs2( pWla->p, pWla->vBlacks, NULL );

    return pAbs;
}